

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

size_t __thiscall
CoreML::Specification::CategoricalDistributionLayerParams::ByteSizeLong
          (CategoricalDistributionLayerParams *this)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  
  if (this->seed_ == 0) {
    sVar4 = 0;
  }
  else {
    uVar2 = this->seed_ | 1;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar4 = (ulong)((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  if (this->numsamples_ != 0) {
    uVar2 = this->numsamples_ | 1;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar4 = sVar4 + ((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  sVar3 = sVar4 + 2;
  if (this->islogits_ == false) {
    sVar3 = sVar4;
  }
  sVar4 = sVar3;
  if (this->eps_ != 0.0) {
    sVar4 = sVar3 + 5;
  }
  if (NAN(this->eps_)) {
    sVar4 = sVar3 + 5;
  }
  sVar3 = sVar4;
  if (this->temperature_ != 0.0) {
    sVar3 = sVar4 + 5;
  }
  if (NAN(this->temperature_)) {
    sVar3 = sVar4 + 5;
  }
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

inline ::google::protobuf::int64 CategoricalDistributionLayerParams::seed() const {
  // @@protoc_insertion_point(field_get:CoreML.Specification.CategoricalDistributionLayerParams.seed)
  return seed_;
}